

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase629::run(TestCase629 *this)

{
  StructDataBitCount *this_00;
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  Builder value_05;
  Builder value_06;
  bool bVar1;
  DebugExpression<const_char_(&)[94]> DVar2;
  Builder *params;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *params_00;
  Builder *extraout_RDX_01;
  Builder *extraout_RDX_02;
  Builder *params_01;
  Builder *extraout_RDX_03;
  Builder *extraout_RDX_04;
  Builder *params_02;
  Builder *extraout_RDX_05;
  Builder *pBVar3;
  Builder *extraout_RDX_06;
  undefined8 in_stack_fffffffffffff728;
  Builder local_858;
  StringTree local_828;
  String local_7f0;
  bool local_7d1;
  undefined1 auStack_7d0 [7];
  bool _kj_shouldLog_7;
  SegmentBuilder *pSStack_7c8;
  CapTableBuilder *local_7c0;
  void *pvStack_7b8;
  WirePointer *local_7b0;
  undefined8 uStack_7a8;
  StringTree local_7a0;
  String local_768;
  char (*local_750) [94];
  undefined1 local_748 [8];
  DebugComparison<const_char_(&)[94],_kj::String> _kjCondition_7;
  bool local_6f1;
  undefined1 local_6f0 [7];
  bool _kj_shouldLog_6;
  char (*local_6d8) [86];
  undefined1 local_6d0 [8];
  DebugComparison<const_char_(&)[86],_kj::String> _kjCondition_6;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  StringTree local_668;
  String local_630;
  bool local_611;
  undefined1 auStack_610 [7];
  bool _kj_shouldLog_5;
  SegmentBuilder *pSStack_608;
  CapTableBuilder *local_600;
  void *pvStack_5f8;
  WirePointer *local_5f0;
  undefined8 uStack_5e8;
  StringTree local_5e0;
  String local_5a8;
  char (*local_590) [96];
  undefined1 local_588 [8];
  DebugComparison<const_char_(&)[96],_kj::String> _kjCondition_5;
  bool local_531;
  undefined1 local_530 [7];
  bool _kj_shouldLog_4;
  char (*local_518) [88];
  undefined1 local_510 [8];
  DebugComparison<const_char_(&)[88],_kj::String> _kjCondition_4;
  Builder local_4c8;
  StringTree local_498;
  String local_460;
  bool local_441;
  undefined1 auStack_440 [7];
  bool _kj_shouldLog_3;
  SegmentBuilder *pSStack_438;
  CapTableBuilder *local_430;
  void *pvStack_428;
  WirePointer *local_420;
  undefined8 uStack_418;
  StringTree local_410;
  String local_3d8;
  char (*local_3c0) [75];
  undefined1 local_3b8 [8];
  DebugComparison<const_char_(&)[75],_kj::String> _kjCondition_3;
  bool local_361;
  undefined1 local_360 [7];
  bool _kj_shouldLog_2;
  char (*local_348) [69];
  undefined1 local_340 [8];
  DebugComparison<const_char_(&)[69],_kj::String> _kjCondition_2;
  Builder local_2f8;
  StringTree local_2c8;
  String local_290;
  bool local_271;
  undefined1 auStack_270 [7];
  bool _kj_shouldLog_1;
  SegmentBuilder *pSStack_268;
  CapTableBuilder *local_260;
  void *pvStack_258;
  WirePointer *local_250;
  undefined8 uStack_248;
  StringTree local_240;
  String local_208;
  char (*local_1f0) [24];
  undefined1 local_1e8 [8];
  DebugComparison<const_char_(&)[24],_kj::String> _kjCondition_1;
  bool local_191;
  undefined1 local_190 [7];
  bool _kj_shouldLog;
  char (*local_178) [24];
  undefined1 local_170 [8];
  DebugComparison<const_char_(&)[24],_kj::String> _kjCondition;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase629 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestUnnamedUnion>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestUnnamedUnion::Builder::setBar((Builder *)local_128,0x7b);
  local_178 = (char (*) [24])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [24])"(middle = 0, bar = 123)");
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)local_190,(kj *)local_128,params);
  kj::_::DebugExpression<char_const(&)[24]>::operator==
            ((DebugComparison<const_char_(&)[24],_kj::String> *)local_170,
             (DebugExpression<char_const(&)[24]> *)&local_178,(String *)local_190);
  kj::String::~String((String *)local_190);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_170);
  if (!bVar1) {
    local_191 = kj::_::Debug::shouldLog(ERROR);
    pBVar3 = extraout_RDX;
    while (local_191 != false) {
      kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
                ((String *)&_kjCondition_1.result,(kj *)local_128,pBVar3);
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[24],kj::String>&,char_const(&)[24],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x27b,ERROR,
                 "\"failed: expected \" \"(\\\"(middle = 0, bar = 123)\\\") == (kj::str(root))\", _kjCondition, \"(middle = 0, bar = 123)\", kj::str(root)"
                 ,(char (*) [64])"failed: expected (\"(middle = 0, bar = 123)\") == (kj::str(root))"
                 ,(DebugComparison<const_char_(&)[24],_kj::String> *)local_170,
                 (char (*) [24])"(middle = 0, bar = 123)",(String *)&_kjCondition_1.result);
      kj::String::~String((String *)&_kjCondition_1.result);
      pBVar3 = extraout_RDX_00;
      local_191 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[24],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[24],_kj::String> *)local_170);
  local_1f0 = (char (*) [24])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [24])"(middle = 0, bar = 123)");
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestUnnamedUnion::Builder&,void>
            ((Builder *)auStack_270,(Builder *)local_128);
  value.builder.segment = (SegmentBuilder *)local_260;
  value.schema.super_Schema.raw = (Schema)(Schema)pSStack_268;
  value.builder.capTable = (CapTableBuilder *)pvStack_258;
  value.builder.data = local_250;
  value.builder.pointers = (WirePointer *)uStack_248;
  value.builder.dataSize = (int)in_stack_fffffffffffff728;
  value.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff728 >> 0x20);
  value.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff728 >> 0x30);
  prettyPrint(value);
  kj::StringTree::flatten(&local_208,&local_240);
  kj::_::DebugExpression<char_const(&)[24]>::operator==
            ((DebugComparison<const_char_(&)[24],_kj::String> *)local_1e8,
             (DebugExpression<char_const(&)[24]> *)&local_1f0,&local_208);
  kj::String::~String(&local_208);
  kj::StringTree::~StringTree(&local_240);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    local_271 = kj::_::Debug::shouldLog(ERROR);
    while (local_271 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestUnnamedUnion::Builder&,void>
                (&local_2f8,(Builder *)local_128);
      value_00.builder.segment = (SegmentBuilder *)local_2f8.builder.capTable;
      value_00.schema.super_Schema.raw = (Schema)(Schema)local_2f8.builder.segment;
      value_00.builder.capTable = (CapTableBuilder *)local_2f8.builder.data;
      value_00.builder.data = local_2f8.builder.pointers;
      value_00.builder.pointers = (WirePointer *)local_2f8.builder._32_8_;
      value_00.builder.dataSize = (int)in_stack_fffffffffffff728;
      value_00.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff728 >> 0x20);
      value_00.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff728 >> 0x30);
      prettyPrint(value_00);
      kj::StringTree::flatten(&local_290,&local_2c8);
      kj::_::Debug::
      log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[24],kj::String>&,char_const(&)[24],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x27c,ERROR,
                 "\"failed: expected \" \"(\\\"(middle = 0, bar = 123)\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"(middle = 0, bar = 123)\", prettyPrint(root).flatten()"
                 ,(char (*) [78])
                  "failed: expected (\"(middle = 0, bar = 123)\") == (prettyPrint(root).flatten())",
                 (DebugComparison<const_char_(&)[24],_kj::String> *)local_1e8,
                 (char (*) [24])"(middle = 0, bar = 123)",&local_290);
      kj::String::~String(&local_290);
      kj::StringTree::~StringTree(&local_2c8);
      local_271 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[24],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[24],_kj::String> *)local_1e8);
  Text::Reader::Reader((Reader *)&_kjCondition_2.result,"foooooooooooooooooooooooooooooooo");
  capnproto_test::capnp::test::TestUnnamedUnion::Builder::setAfter
            ((Builder *)local_128,(Reader)stack0xfffffffffffffcf8);
  local_348 = (char (*) [69])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [69])
                         "(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")");
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)local_360,(kj *)local_128,params_00);
  kj::_::DebugExpression<char_const(&)[69]>::operator==
            ((DebugComparison<const_char_(&)[69],_kj::String> *)local_340,
             (DebugExpression<char_const(&)[69]> *)&local_348,(String *)local_360);
  kj::String::~String((String *)local_360);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_340);
  if (!bVar1) {
    local_361 = kj::_::Debug::shouldLog(ERROR);
    pBVar3 = extraout_RDX_01;
    while (local_361 != false) {
      kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
                ((String *)&_kjCondition_3.result,(kj *)local_128,pBVar3);
      kj::_::Debug::
      log<char_const(&)[111],kj::_::DebugComparison<char_const(&)[69],kj::String>&,char_const(&)[69],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x281,ERROR,
                 "\"failed: expected \" \"(\\\"(middle = 0, bar = 123, after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(middle = 0, bar = 123, after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
                 ,(char (*) [111])
                  "failed: expected (\"(middle = 0, bar = 123, after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
                 ,(DebugComparison<const_char_(&)[69],_kj::String> *)local_340,
                 (char (*) [69])
                 "(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")",
                 (String *)&_kjCondition_3.result);
      kj::String::~String((String *)&_kjCondition_3.result);
      pBVar3 = extraout_RDX_02;
      local_361 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[69],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[69],_kj::String> *)local_340);
  local_3c0 = (char (*) [75])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [75])
                         "( middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
                        );
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestUnnamedUnion::Builder&,void>
            ((Builder *)auStack_440,(Builder *)local_128);
  value_01.builder.segment = (SegmentBuilder *)local_430;
  value_01.schema.super_Schema.raw = (Schema)(Schema)pSStack_438;
  value_01.builder.capTable = (CapTableBuilder *)pvStack_428;
  value_01.builder.data = local_420;
  value_01.builder.pointers = (WirePointer *)uStack_418;
  value_01.builder.dataSize = (int)in_stack_fffffffffffff728;
  value_01.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff728 >> 0x20);
  value_01.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff728 >> 0x30);
  prettyPrint(value_01);
  kj::StringTree::flatten(&local_3d8,&local_410);
  kj::_::DebugExpression<char_const(&)[75]>::operator==
            ((DebugComparison<const_char_(&)[75],_kj::String> *)local_3b8,
             (DebugExpression<char_const(&)[75]> *)&local_3c0,&local_3d8);
  kj::String::~String(&local_3d8);
  kj::StringTree::~StringTree(&local_410);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b8);
  if (!bVar1) {
    local_441 = kj::_::Debug::shouldLog(ERROR);
    while (local_441 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestUnnamedUnion::Builder&,void>
                (&local_4c8,(Builder *)local_128);
      value_02.builder.segment = (SegmentBuilder *)local_4c8.builder.capTable;
      value_02.schema.super_Schema.raw = (Schema)(Schema)local_4c8.builder.segment;
      value_02.builder.capTable = (CapTableBuilder *)local_4c8.builder.data;
      value_02.builder.data = local_4c8.builder.pointers;
      value_02.builder.pointers = (WirePointer *)local_4c8.builder._32_8_;
      value_02.builder.dataSize = (int)in_stack_fffffffffffff728;
      value_02.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff728 >> 0x20);
      value_02.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff728 >> 0x30);
      prettyPrint(value_02);
      kj::StringTree::flatten(&local_460,&local_498);
      kj::_::Debug::
      log<char_const(&)[139],kj::_::DebugComparison<char_const(&)[75],kj::String>&,char_const(&)[75],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x286,ERROR,
                 "\"failed: expected \" \"(\\\"( middle = 0,\\\\n\\\" \\\"  bar = 123,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
                 ,(char (*) [139])
                  "failed: expected (\"( middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[75],_kj::String> *)local_3b8,
                 (char (*) [75])
                 "( middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )",
                 &local_460);
      kj::String::~String(&local_460);
      kj::StringTree::~StringTree(&local_498);
      local_441 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[75],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[75],_kj::String> *)local_3b8);
  Text::Reader::Reader((Reader *)&_kjCondition_4.result,"before");
  capnproto_test::capnp::test::TestUnnamedUnion::Builder::setBefore
            ((Builder *)local_128,(Reader)stack0xfffffffffffffb28);
  local_518 = (char (*) [88])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [88])
                         "(before = \"before\", middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")"
                        );
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)local_530,(kj *)local_128,params_01);
  kj::_::DebugExpression<char_const(&)[88]>::operator==
            ((DebugComparison<const_char_(&)[88],_kj::String> *)local_510,
             (DebugExpression<char_const(&)[88]> *)&local_518,(String *)local_530);
  kj::String::~String((String *)local_530);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_510);
  if (!bVar1) {
    local_531 = kj::_::Debug::shouldLog(ERROR);
    pBVar3 = extraout_RDX_03;
    while (local_531 != false) {
      kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
                ((String *)&_kjCondition_5.result,(kj *)local_128,pBVar3);
      kj::_::Debug::
      log<char_const(&)[135],kj::_::DebugComparison<char_const(&)[88],kj::String>&,char_const(&)[88],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x28b,ERROR,
                 "\"failed: expected \" \"(\\\"(before = \\\\\\\"before\\\\\\\", middle = 0, bar = 123, \\\" \\\"after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(before = \\\"before\\\", middle = 0, bar = 123, \" \"after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
                 ,(char (*) [135])
                  "failed: expected (\"(before = \\\"before\\\", middle = 0, bar = 123, \" \"after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
                 ,(DebugComparison<const_char_(&)[88],_kj::String> *)local_510,
                 (char (*) [88])
                 "(before = \"before\", middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")"
                 ,(String *)&_kjCondition_5.result);
      kj::String::~String((String *)&_kjCondition_5.result);
      pBVar3 = extraout_RDX_04;
      local_531 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[88],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[88],_kj::String> *)local_510);
  local_590 = (char (*) [96])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [96])
                         "( before = \"before\",\n  middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
                        );
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestUnnamedUnion::Builder&,void>
            ((Builder *)auStack_610,(Builder *)local_128);
  value_03.builder.segment = (SegmentBuilder *)local_600;
  value_03.schema.super_Schema.raw = (Schema)(Schema)pSStack_608;
  value_03.builder.capTable = (CapTableBuilder *)pvStack_5f8;
  value_03.builder.data = local_5f0;
  value_03.builder.pointers = (WirePointer *)uStack_5e8;
  value_03.builder.dataSize = (int)in_stack_fffffffffffff728;
  value_03.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff728 >> 0x20);
  value_03.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff728 >> 0x30);
  prettyPrint(value_03);
  kj::StringTree::flatten(&local_5a8,&local_5e0);
  kj::_::DebugExpression<char_const(&)[96]>::operator==
            ((DebugComparison<const_char_(&)[96],_kj::String> *)local_588,
             (DebugExpression<char_const(&)[96]> *)&local_590,&local_5a8);
  kj::String::~String(&local_5a8);
  kj::StringTree::~StringTree(&local_5e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_588);
  if (!bVar1) {
    local_611 = kj::_::Debug::shouldLog(ERROR);
    while (local_611 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestUnnamedUnion::Builder&,void>
                ((Builder *)&_kjCondition_6.result,(Builder *)local_128);
      value_04.builder.segment = (SegmentBuilder *)local_688;
      value_04.schema.super_Schema.raw = (Schema)(Schema)uStack_690;
      value_04.builder.capTable = (CapTableBuilder *)uStack_680;
      value_04.builder.data = (void *)local_678;
      value_04.builder.pointers = (WirePointer *)uStack_670;
      value_04.builder.dataSize = (int)in_stack_fffffffffffff728;
      value_04.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff728 >> 0x20);
      value_04.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff728 >> 0x30);
      prettyPrint(value_04);
      kj::StringTree::flatten(&local_630,&local_668);
      kj::_::Debug::
      log<char_const(&)[166],kj::_::DebugComparison<char_const(&)[96],kj::String>&,char_const(&)[96],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x291,ERROR,
                 "\"failed: expected \" \"(\\\"( before = \\\\\\\"before\\\\\\\",\\\\n\\\" \\\"  middle = 0,\\\\n\\\" \\\"  bar = 123,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( before = \\\"before\\\",\\n\" \"  middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
                 ,(char (*) [166])
                  "failed: expected (\"( before = \\\"before\\\",\\n\" \"  middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[96],_kj::String> *)local_588,
                 (char (*) [96])
                 "( before = \"before\",\n  middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
                 ,&local_630);
      kj::String::~String(&local_630);
      kj::StringTree::~StringTree(&local_668);
      local_611 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[96],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[96],_kj::String> *)local_588);
  capnproto_test::capnp::test::TestUnnamedUnion::Builder::setFoo((Builder *)local_128,0);
  local_6d8 = (char (*) [86])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [86])
                         "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")"
                        );
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)local_6f0,(kj *)local_128,params_02);
  kj::_::DebugExpression<char_const(&)[86]>::operator==
            ((DebugComparison<const_char_(&)[86],_kj::String> *)local_6d0,
             (DebugExpression<char_const(&)[86]> *)&local_6d8,(String *)local_6f0);
  kj::String::~String((String *)local_6f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6d0);
  if (!bVar1) {
    local_6f1 = kj::_::Debug::shouldLog(ERROR);
    pBVar3 = extraout_RDX_05;
    while (local_6f1 != false) {
      kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
                ((String *)&_kjCondition_7.result,(kj *)local_128,pBVar3);
      kj::_::Debug::
      log<char_const(&)[130],kj::_::DebugComparison<char_const(&)[86],kj::String>&,char_const(&)[86],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x297,ERROR,
                 "\"failed: expected \" \"(\\\"(before = \\\\\\\"before\\\\\\\", foo = 0, middle = 0, after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(before = \\\"before\\\", foo = 0, middle = 0, after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
                 ,(char (*) [130])
                  "failed: expected (\"(before = \\\"before\\\", foo = 0, middle = 0, after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
                 ,(DebugComparison<const_char_(&)[86],_kj::String> *)local_6d0,
                 (char (*) [86])
                 "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")"
                 ,(String *)&_kjCondition_7.result);
      kj::String::~String((String *)&_kjCondition_7.result);
      pBVar3 = extraout_RDX_06;
      local_6f1 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[86],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[86],_kj::String> *)local_6d0);
  DVar2 = kj::_::DebugExpressionStart::operator<<
                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                     (char (*) [94])
                     "( before = \"before\",\n  foo = 0,\n  middle = 0,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
                    );
  local_750 = DVar2.value;
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestUnnamedUnion::Builder&,void>
            ((Builder *)auStack_7d0,(Builder *)local_128);
  value_05.builder.segment = (SegmentBuilder *)local_7c0;
  value_05.schema.super_Schema.raw = (Schema)(Schema)pSStack_7c8;
  value_05.builder.capTable = (CapTableBuilder *)pvStack_7b8;
  value_05.builder.data = local_7b0;
  value_05.builder.pointers = (WirePointer *)uStack_7a8;
  value_05.builder._32_8_ = DVar2.value;
  prettyPrint(value_05);
  kj::StringTree::flatten(&local_768,&local_7a0);
  kj::_::DebugExpression<char_const(&)[94]>::operator==
            ((DebugComparison<const_char_(&)[94],_kj::String> *)local_748,
             (DebugExpression<char_const(&)[94]> *)&local_750,&local_768);
  kj::String::~String(&local_768);
  kj::StringTree::~StringTree(&local_7a0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_748);
  if (!bVar1) {
    local_7d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7d1 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestUnnamedUnion::Builder&,void>
                (&local_858,(Builder *)local_128);
      value_06.builder.segment = (SegmentBuilder *)local_858.builder.capTable;
      value_06.schema.super_Schema.raw = (Schema)(Schema)local_858.builder.segment;
      value_06.builder.capTable = (CapTableBuilder *)local_858.builder.data;
      value_06.builder.data = local_858.builder.pointers;
      value_06.builder.pointers = (WirePointer *)local_858.builder._32_8_;
      value_06.builder._32_8_ = DVar2.value;
      prettyPrint(value_06);
      kj::StringTree::flatten(&local_7f0,&local_828);
      kj::_::Debug::
      log<char_const(&)[164],kj::_::DebugComparison<char_const(&)[94],kj::String>&,char_const(&)[94],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x29d,ERROR,
                 "\"failed: expected \" \"(\\\"( before = \\\\\\\"before\\\\\\\",\\\\n\\\" \\\"  foo = 0,\\\\n\\\" \\\"  middle = 0,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( before = \\\"before\\\",\\n\" \"  foo = 0,\\n\" \"  middle = 0,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
                 ,(char (*) [164])
                  "failed: expected (\"( before = \\\"before\\\",\\n\" \"  foo = 0,\\n\" \"  middle = 0,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[94],_kj::String> *)local_748,
                 (char (*) [94])
                 "( before = \"before\",\n  foo = 0,\n  middle = 0,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
                 ,&local_7f0);
      kj::String::~String(&local_7f0);
      kj::StringTree::~StringTree(&local_828);
      local_7d1 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[94],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[94],_kj::String> *)local_748);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Stringify, UnnamedUnions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestUnnamedUnion>();

  root.setBar(123);

  EXPECT_EQ("(middle = 0, bar = 123)", kj::str(root));
  EXPECT_EQ("(middle = 0, bar = 123)", prettyPrint(root).flatten());

  root.setAfter("foooooooooooooooooooooooooooooooo");

  EXPECT_EQ("(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")",
            kj::str(root));
  EXPECT_EQ(
      "( middle = 0,\n"
      "  bar = 123,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());

  root.setBefore("before");

  EXPECT_EQ("(before = \"before\", middle = 0, bar = 123, "
      "after = \"foooooooooooooooooooooooooooooooo\")", kj::str(root));
  EXPECT_EQ(
      "( before = \"before\",\n"
      "  middle = 0,\n"
      "  bar = 123,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());

  root.setFoo(0);

  EXPECT_EQ(
      "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")",
      kj::str(root));
  EXPECT_EQ(
      "( before = \"before\",\n"
      "  foo = 0,\n"
      "  middle = 0,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());
}